

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.h
# Opt level: O0

string * Potassco::toString<double,unsigned_int,unsigned_int>(double *x,uint *y,uint *z)

{
  string *psVar1;
  string *in_RCX;
  string *in_RDI;
  string res;
  undefined8 in_stack_ffffffffffffff88;
  string *out;
  string local_40 [24];
  double in_stack_ffffffffffffffd8;
  
  out = in_RDI;
  std::__cxx11::string::string(local_40);
  psVar1 = xconvert(in_RCX,in_stack_ffffffffffffffd8);
  std::__cxx11::string::append((ulong)psVar1,'\x01');
  psVar1 = xconvert(out,(uint)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  std::__cxx11::string::append((ulong)psVar1,'\x01');
  psVar1 = xconvert(out,(uint)((ulong)psVar1 >> 0x20));
  std::__cxx11::string::string((string *)out,(string *)psVar1);
  std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

std::string toString(const T& x, const U& y, const V& z) {
	std::string res;
	xconvert(res, x).append(1, ',');
	xconvert(res, y).append(1, ',');
	return xconvert(res, z);
}